

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon_p.h
# Opt level: O0

bool QXkbCommon::isKeypad(xkb_keysym_t sym)

{
  xkb_keysym_t sym_local;
  bool local_1;
  
  if ((((sym == 0xff80) || (sym == 0xff89)) || (sym == 0xff8d)) ||
     (((sym - 0xff91 < 0xf || (sym - 0xffaa < 0x10)) || (sym == 0xffbd)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool isKeypad(xkb_keysym_t sym) {
        switch (sym) {
        case XKB_KEY_KP_Space:
        case XKB_KEY_KP_Tab:
        case XKB_KEY_KP_Enter:
        case XKB_KEY_KP_F1:
        case XKB_KEY_KP_F2:
        case XKB_KEY_KP_F3:
        case XKB_KEY_KP_F4:
        case XKB_KEY_KP_Home:
        case XKB_KEY_KP_Left:
        case XKB_KEY_KP_Up:
        case XKB_KEY_KP_Right:
        case XKB_KEY_KP_Down:
        case XKB_KEY_KP_Prior:
        case XKB_KEY_KP_Next:
        case XKB_KEY_KP_End:
        case XKB_KEY_KP_Begin:
        case XKB_KEY_KP_Insert:
        case XKB_KEY_KP_Delete:
        case XKB_KEY_KP_Equal:
        case XKB_KEY_KP_Multiply:
        case XKB_KEY_KP_Add:
        case XKB_KEY_KP_Separator:
        case XKB_KEY_KP_Subtract:
        case XKB_KEY_KP_Decimal:
        case XKB_KEY_KP_Divide:
        case XKB_KEY_KP_0:
        case XKB_KEY_KP_1:
        case XKB_KEY_KP_2:
        case XKB_KEY_KP_3:
        case XKB_KEY_KP_4:
        case XKB_KEY_KP_5:
        case XKB_KEY_KP_6:
        case XKB_KEY_KP_7:
        case XKB_KEY_KP_8:
        case XKB_KEY_KP_9:
            return true;
        default:
            return false;
        }
    }